

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

BOOL __thiscall
Js::RecyclableProxyObjectWalker::GetGroupObject
          (RecyclableProxyObjectWalker *this,ResolvedObject *pResolvedObject)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar5;
  RecyclableProxyObjectDisplay *this_00;
  TrackAllocData local_58;
  ResolvedObject *local_30;
  ResolvedObject *pResolvedObject_local;
  RecyclableProxyObjectWalker *this_local;
  TypeId local_18;
  TypeId local_14;
  RecyclableObject *pRStack_10;
  TypeId typeId;
  
  pResolvedObject->name = L"[Proxy]";
  pResolvedObject->propId = -1;
  pResolvedObject->obj = (this->super_RecyclableObjectWalker).instance;
  pResolvedObject->scriptContext = (this->super_RecyclableObjectWalker).scriptContext;
  this_local = (RecyclableProxyObjectWalker *)pResolvedObject->obj;
  local_30 = pResolvedObject;
  pResolvedObject_local = (ResolvedObject *)this;
  if (this_local == (RecyclableProxyObjectWalker *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = TaggedInt::Is(this_local);
  if (bVar2) {
    local_18 = TypeIds_FirstNumberType;
  }
  else {
    bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(this_local);
    if (bVar2) {
      local_18 = TypeIds_Number;
    }
    else {
      pRStack_10 = UnsafeVarTo<Js::RecyclableObject>(this_local);
      if (pRStack_10 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      local_14 = RecyclableObject::GetTypeId(pRStack_10);
      if (0x57 < (int)local_14) {
        BVar3 = RecyclableObject::IsExternal(pRStack_10);
        if (BVar3 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
      }
      local_18 = local_14;
    }
  }
  local_30->typeId = local_18;
  local_30->address = (IDiagObjectAddress *)0x0;
  pAVar5 = &GetArenaFromContext((this->super_RecyclableObjectWalker).scriptContext)->
            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,(type_info *)&RecyclableProxyObjectDisplay::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
             ,0xea4);
  pAVar5 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar5,&local_58);
  this_00 = (RecyclableProxyObjectDisplay *)
            new<Memory::ArenaAllocator>(0x38,(ArenaAllocator *)pAVar5,0x3f67b0);
  RecyclableProxyObjectDisplay::RecyclableProxyObjectDisplay(this_00,local_30);
  local_30->objectDisplay = (IDiagObjectModelDisplay *)this_00;
  (*local_30->objectDisplay->_vptr_IDiagObjectModelDisplay[6])(local_30->objectDisplay,0x820);
  return 1;
}

Assistant:

BOOL RecyclableProxyObjectWalker::GetGroupObject(ResolvedObject* pResolvedObject)
    {
        pResolvedObject->name = _u("[Proxy]");
        pResolvedObject->propId = Constants::NoProperty;
        pResolvedObject->obj = instance;
        pResolvedObject->scriptContext = scriptContext;
        pResolvedObject->typeId = JavascriptOperators::GetTypeId(pResolvedObject->obj);
        pResolvedObject->address = nullptr;

        pResolvedObject->objectDisplay = Anew(GetArenaFromContext(scriptContext), RecyclableProxyObjectDisplay, pResolvedObject);
        pResolvedObject->objectDisplay->SetDefaultTypeAttribute(DBGPROP_ATTRIB_VALUE_READONLY | DBGPROP_ATTRIB_VALUE_IS_FAKE);
        return TRUE;
    }